

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes2CapabilityTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles2::GetIntCase::iterate(GetIntCase *this)

{
  TestContext *this_00;
  GLenum err;
  deBool dVar1;
  TestLog *this_01;
  MessageBuilder *pMVar2;
  char *description;
  Enum<int,_2UL> EVar3;
  string local_1e8;
  GetNameFunc local_1c8;
  int local_1c0;
  Enum<int,_2UL> local_1a8;
  MessageBuilder local_198;
  GLint local_14;
  GetIntCase *pGStack_10;
  GLint value;
  GetIntCase *this_local;
  
  local_14 = 0;
  pGStack_10 = this;
  do {
    glwGetIntegerv(this->m_param,&local_14);
    err = glwGetError();
    glu::checkError(err,"glGetIntegerv(m_param, &value)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/tes2CapabilityTests.cpp"
                    ,0x38);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  this_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_198,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  EVar3 = glu::getParamQueryStr(this->m_param);
  local_1c8 = EVar3.m_getName;
  local_1c0 = EVar3.m_value;
  local_1a8.m_getName = local_1c8;
  local_1a8.m_value = local_1c0;
  pMVar2 = tcu::MessageBuilder::operator<<(&local_198,&local_1a8);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [4])0x2bdb312);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_14);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
  de::toString<int>(&local_1e8,&local_14);
  description = (char *)std::__cxx11::string::c_str();
  tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,description);
  std::__cxx11::string::~string((string *)&local_1e8);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		GLint value = 0;
		GLU_CHECK_CALL(glGetIntegerv(m_param, &value));

		m_testCtx.getLog() << TestLog::Message << glu::getParamQueryStr(m_param) << " = " << value << TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(value).c_str());
		return STOP;
	}